

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManArePerform(Gia_Man_t *pAig,int nStatesMax,int fMiter,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  Gia_Man_t *pGVar7;
  Gia_ManAre_t *p;
  Gia_Obj_t *pGVar8;
  Gia_StaAre_t *pSta;
  Abc_Cex_t *pAVar9;
  abctime aVar10;
  abctime aVar11;
  abctime aVar12;
  Gia_PtrAre_t Sta;
  int level;
  Gia_ManAre_t *pGVar13;
  char *pcVar14;
  int iVar15;
  double dVar16;
  double local_58;
  int local_4c;
  
  aVar6 = Abc_Clock();
  if (pAig->nRegs < 0x4001) {
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar7 = Gia_ManDup(pAig);
    p = Gia_ManAreCreate(pGVar7);
    p->fMiter = fMiter;
    pGVar7 = p->pAig;
    for (iVar15 = 0; iVar15 < pGVar7->nRegs; iVar15 = iVar15 + 1) {
      pGVar8 = Gia_ManCo(pGVar7,(pGVar7->vCos->nSize - pGVar7->nRegs) + iVar15);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      pGVar8->Value = 0;
    }
    pSta = Gia_ManAreCreateStaNew(p);
    Gia_ManAreCubeProcess(p,pSta);
    Sta = (Gia_PtrAre_t)0x1;
    local_4c = 1;
    while( true ) {
      p->iStaCur = (int)Sta;
      if (p->nStas <= (int)Sta) break;
      iVar15 = Gia_ManAreDeriveNexts(p,Sta);
      if ((iVar15 != 0) || (nStatesMax < p->nStas)) {
        pAVar9 = Gia_ManAreDeriveCex(p,p->pTarget);
        pAig->pCexSeq = pAVar9;
      }
      if (p->fStopped != 0) {
        local_4c = -1;
        break;
      }
      if (fVerbose != 0) {
        Gia_ManArePrintReport(p,aVar6,0);
      }
      Sta = (Gia_PtrAre_t)(p->iStaCur + 1);
    }
    Gia_ManArePrintReport(p,aVar6,1);
    pcVar14 = "Stopped";
    if (p->fStopped == 0) {
      pcVar14 = "Completed";
    }
    iVar15 = p->nStas;
    uVar4 = Gia_ManAreListCountUsed_rec(p,p->Root,p->fTree);
    uVar5 = Gia_ManAreDepth(p,p->iStaCur + -1);
    level = 0x7b2ecb;
    printf("%s after finding %d state cubes (%d not contained) with depth %d.  ",pcVar14,iVar15,
           (ulong)uVar4,(ulong)uVar5);
    Abc_Print(level,"%s =","Time");
    aVar10 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar10 - aVar6) / 1000000.0);
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      uVar4 = p->iStaCur;
      pcVar14 = pAig->pName;
      pGVar13 = p;
      iVar15 = Gia_ManAreDepth(p,uVar4);
      level = (int)pGVar13;
      Abc_Print(level,"Output %d of miter \"%s\" was asserted in frame %d.\n",(ulong)uVar4,pcVar14,
                (ulong)(iVar15 - 1));
    }
    if (fVerbose != 0) {
      Abc_Print(level,"%s =","Cofactoring");
      iVar15 = p->timeAig;
      iVar1 = p->timeCube;
      aVar10 = Abc_Clock();
      local_58 = 0.0;
      dVar16 = 0.0;
      if (aVar10 != aVar6) {
        iVar2 = p->timeAig;
        iVar3 = p->timeCube;
        aVar10 = Abc_Clock();
        dVar16 = ((double)(iVar2 - iVar3) * 100.0) / (double)(aVar10 - aVar6);
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)(iVar15 - iVar1) / 1000000.0,dVar16);
      Abc_Print(level,"%s =","Containment");
      iVar15 = p->timeCube;
      aVar10 = Abc_Clock();
      if (aVar10 != aVar6) {
        iVar1 = p->timeCube;
        aVar10 = Abc_Clock();
        local_58 = ((double)iVar1 * 100.0) / (double)(aVar10 - aVar6);
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)iVar15 / 1000000.0,local_58);
      Abc_Print(level,"%s =","Other      ");
      aVar10 = Abc_Clock();
      iVar15 = p->timeAig;
      aVar11 = Abc_Clock();
      local_58 = 0.0;
      dVar16 = 0.0;
      if (aVar11 != aVar6) {
        aVar11 = Abc_Clock();
        iVar1 = p->timeAig;
        aVar12 = Abc_Clock();
        dVar16 = ((double)(aVar11 - (iVar1 + aVar6)) * 100.0) / (double)(aVar12 - aVar6);
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)(aVar10 - (iVar15 + aVar6)) / 1000000.0,
                dVar16);
      Abc_Print(level,"%s =","TOTAL      ");
      aVar10 = Abc_Clock();
      aVar11 = Abc_Clock();
      if (aVar11 != aVar6) {
        aVar11 = Abc_Clock();
        aVar12 = Abc_Clock();
        local_58 = ((double)(aVar11 - aVar6) * 100.0) / (double)(aVar12 - aVar6);
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)(aVar10 - aVar6) / 1000000.0,local_58);
    }
    if (pAig->nRegs < 0x1f) {
      aVar6 = Abc_Clock();
      uVar4 = Gia_ManCountMinterms(p);
      iVar15 = 0x7b2f2d;
      printf("The number of unique state minterms in computed state cubes is %d.   ",(ulong)uVar4);
      Abc_Print(iVar15,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar10 - aVar6) / 1000000.0);
    }
    Gia_ManAreFree(p);
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      local_4c = 0;
      iVar15 = Gia_ManVerifyCex(pAig,pAig->pCexSeq,0);
      if (iVar15 == 0) {
        pcVar14 = "Generated counter-example is INVALID.                       ";
      }
      else {
        pcVar14 = "Generated counter-example verified correctly.               ";
      }
      puts(pcVar14);
    }
  }
  else {
    printf("Currently can only handle circuit with up to %d registers.\n",0x4000);
    local_4c = -1;
  }
  return local_4c;
}

Assistant:

int Gia_ManArePerform( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fVerbose )
{
//    extern Gia_Man_t * Gia_ManCompress2( Gia_Man_t * p, int fUpdateLevel, int fVerbose );
    extern Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast );
    Gia_ManAre_t * p;
    abctime clk = Abc_Clock();
    int RetValue = 1;
    if ( Gia_ManRegNum(pAig) > MAX_VARS_NUM )
    {
        printf( "Currently can only handle circuit with up to %d registers.\n", MAX_VARS_NUM );
        return -1;
    }
    ABC_FREE( pAig->pCexSeq );
//    p = Gia_ManAreCreate( Gia_ManCompress2(pAig, 0, 0) );
    p = Gia_ManAreCreate( Gia_ManDup(pAig) );
    p->fMiter = fMiter;
    Gia_ManAreCubeProcess( p, Gia_ManAreCreateStaInit(p) );
    for ( p->iStaCur = 1; p->iStaCur < p->nStas; p->iStaCur++ )
    {
//        printf( "Explored state %d. Total cubes %d.\n", p->iStaCur, p->nStas-1 );
        if ( Gia_ManAreDeriveNexts( p, Gia_Int2Ptr(p->iStaCur) ) || p->nStas > nStatesMax )
            pAig->pCexSeq = Gia_ManAreDeriveCex( p, p->pTarget );
        if ( p->fStopped )
        {
            RetValue = -1;
            break;
        }
        if ( fVerbose )//&& p->iStaCur % 5000 == 0 )
            Gia_ManArePrintReport( p, clk, 0 );
    }
    Gia_ManArePrintReport( p, clk, 1 );
    printf( "%s after finding %d state cubes (%d not contained) with depth %d.  ", 
        p->fStopped ? "Stopped" : "Completed", 
        p->nStas, Gia_ManAreListCountUsed(p), 
        Gia_ManAreDepth(p, p->iStaCur-1) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    if ( pAig->pCexSeq != NULL )
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", 
            p->iStaCur, pAig->pName, Gia_ManAreDepth(p, p->iStaCur)-1 );
    if ( fVerbose )
    {
        ABC_PRTP( "Cofactoring", p->timeAig - p->timeCube,    Abc_Clock() - clk );
        ABC_PRTP( "Containment", p->timeCube,                 Abc_Clock() - clk );
        ABC_PRTP( "Other      ", Abc_Clock() - clk - p->timeAig,  Abc_Clock() - clk );
        ABC_PRTP( "TOTAL      ", Abc_Clock() - clk,               Abc_Clock() - clk );
    }
    if ( Gia_ManRegNum(pAig) <= 30 )
    {
        clk = Abc_Clock();
        printf( "The number of unique state minterms in computed state cubes is %d.   ", Gia_ManCountMinterms(p) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
//    printf( "Compares = %d.  Equals = %d.  Disj = %d.  Disj2 = %d.  Disj3 = %d.\n", 
//        p->nCompares, p->nEquals, p->nDisjs, p->nDisjs2, p->nDisjs3 );
//    Gia_ManAreFindBestVar( p, Gia_ManAreSta(p, p->Root) );
//    Gia_ManArePrintUsed( p );
    Gia_ManAreFree( p );
    // verify
    if ( pAig->pCexSeq )
    {
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            printf( "Generated counter-example is INVALID.                       \n" );
        else
            printf( "Generated counter-example verified correctly.               \n" );
        return 0;
    }
    return RetValue;
}